

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Mapper2_prg_rom_should_not_be_writable_Test::TestBody
          (Mapper2_prg_rom_should_not_be_writable_Test *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  pointer pIVar4;
  char *pcVar5;
  Mapper in_R8D;
  AssertHelper local_228;
  Message local_220;
  uchar local_215;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8;
  uchar local_1ed;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> rom;
  stringstream local_1c0 [8];
  stringstream ss;
  undefined1 local_38 [8];
  string bytes;
  int kPrgRomBanks;
  Mapper2_prg_rom_should_not_be_writable_Test *this_local;
  
  bytes.field_2._12_4_ = 2;
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_38,(_anonymous_namespace_ *)0x2,'\x01','\x02',in_R8D);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1c0,(string *)local_38,_Var2);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&gtest_ar.message_,(istream *)local_1c0);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  (*pIVar4->_vptr_IRom[4])(pIVar4,0x8000,0x11);
  local_1ec = 0;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0x8000);
  local_1ed = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_1e8,"0x00","rom->cpu_read_byte(0x8000)",&local_1ec,&local_1ed);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x129,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  (*pIVar4->_vptr_IRom[4])(pIVar4,0xffff,0x12);
  local_214 = 0;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0xffff);
  local_215 = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_210,"0x00","rom->cpu_read_byte(0xFFFF)",&local_214,&local_215);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,299,pcVar5);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST(Mapper2, prg_rom_should_not_be_writable) {
    constexpr int kPrgRomBanks = 2;
    std::string bytes{nrom_bytes(kPrgRomBanks, 1, Mapper::Mapper2)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    rom->cpu_write_byte(0x8000, 0x11);
    EXPECT_EQ(0x00, rom->cpu_read_byte(0x8000));
    rom->cpu_write_byte(0xFFFF, 0x12);
    EXPECT_EQ(0x00, rom->cpu_read_byte(0xFFFF));
}